

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::AllocateOptions
          (DescriptorBuilder *this,FileDescriptorProto *proto,FileDescriptor *descriptor,
          FlatAllocator *alloc)

{
  Span<const_int> options_path_00;
  OptionsType *pOVar1;
  FeatureSet *pFVar2;
  string_view sVar3;
  basic_string_view<char,_std::char_traits<char>_> local_130;
  pointer local_120;
  size_type sStack_118;
  string_view local_110;
  AlphaNum local_100;
  AlphaNum *local_d0;
  char *local_c8;
  AlphaNum local_c0;
  string local_90;
  string_view local_70;
  OptionsType *local_60;
  OptionsType *options;
  value_type_conflict3 local_44;
  undefined1 local_40 [8];
  vector<int,_std::allocator<int>_> options_path;
  FlatAllocator *alloc_local;
  FileDescriptor *descriptor_local;
  FileDescriptorProto *proto_local;
  DescriptorBuilder *this_local;
  AlphaNum *b;
  
  options_path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)alloc;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_40);
  local_44 = 8;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)local_40,&local_44);
  sVar3 = FileDescriptor::package(descriptor);
  local_c8 = sVar3._M_str;
  b = (AlphaNum *)sVar3._M_len;
  local_d0 = b;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_c0,sVar3);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_100,".dummy");
  absl::lts_20250127::StrCat_abi_cxx11_(&local_90,(lts_20250127 *)&local_c0,&local_100,b);
  local_70 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_90);
  local_110 = FileDescriptor::name(descriptor);
  absl::lts_20250127::Span<int_const>::
  Span<std::vector<int,std::allocator<int>>,void,std::vector<int,std::allocator<int>>,int>
            ((Span<int_const> *)&local_120,(vector<int,_std::allocator<int>_> *)local_40);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_130,"google.protobuf.FileOptions");
  options_path_00.len_ = sStack_118;
  options_path_00.ptr_ = local_120;
  sVar3._M_str = local_130._M_str;
  sVar3._M_len = local_130._M_len;
  pOVar1 = AllocateOptionsImpl<google::protobuf::FileDescriptor>
                     (this,local_70,local_110,proto,options_path_00,sVar3,
                      (FlatAllocator *)
                      options_path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)&local_90);
  descriptor->options_ = pOVar1;
  local_60 = pOVar1;
  pFVar2 = FeatureSet::default_instance();
  descriptor->proto_features_ = pFVar2;
  pFVar2 = FeatureSet::default_instance();
  descriptor->merged_features_ = pFVar2;
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_40);
  return;
}

Assistant:

void DescriptorBuilder::AllocateOptions(const FileDescriptorProto& proto,
                                        FileDescriptor* descriptor,
                                        internal::FlatAllocator& alloc) {
  std::vector<int> options_path;
  options_path.push_back(FileDescriptorProto::kOptionsFieldNumber);
  // We add the dummy token so that LookupSymbol does the right thing.
  auto options = AllocateOptionsImpl<FileDescriptor>(
      absl::StrCat(descriptor->package(), ".dummy"), descriptor->name(), proto,
      options_path, "google.protobuf.FileOptions", alloc);
  descriptor->options_ = options;
  descriptor->proto_features_ = &FeatureSet::default_instance();
  descriptor->merged_features_ = &FeatureSet::default_instance();
}